

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O2

void __thiscall scApp::usage(scApp *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cerr,
                  "  --encode <astc | etc1s | uastc>\n               Compress the image data to ASTC, transcodable ETC1S / BasisLZ or\n               high-quality transcodable UASTC format. Implies --t2.\n               With each encoding option the following encoder specific options\n               become valid, otherwise they are ignored.\n\n    astc:\n               Create a texture in high-quality ASTC format.\n      --astc_blk_d <XxY | XxYxZ>\n               Specify block dimension to use for compressing the textures.\n               e.g. --astc_blk_d 6x5 for 2D or --astc_blk_d 6x6x6 for 3D.\n               6x6 is the default for 2D.\n\n                   Supported 2D block dimensions are:\n\n                       4x4: 8.00 bpp         10x5:  2.56 bpp\n                       5x4: 6.40 bpp         10x6:  2.13 bpp\n                       5x5: 5.12 bpp         8x8:   2.00 bpp\n                       6x5: 4.27 bpp         10x8:  1.60 bpp\n                       6x6: 3.56 bpp         10x10: 1.28 bpp\n                       8x5: 3.20 bpp         12x10: 1.07 bpp\n                       8x6: 2.67 bpp         12x12: 0.89 bpp\n\n                   Supported 3D block dimensions are:\n\n                       3x3x3: 4.74 bpp       5x5x4: 1.28 bpp\n                       4x3x3: 3.56 bpp       5x5x5: 1.02 bpp\n                       4x4x3: 2.67 bpp       6x5x5: 0.85 bpp\n                       4x4x4: 2.00 bpp       6x6x5: 0.71 bpp\n                       5x4x4: 1.60 bpp       6x6x6: 0.59 bpp\n      --astc_mode <ldr | hdr>\n               Specify which encoding mode to use. LDR is the default unless the\n               input image is 16-bit in which case the default is HDR.\n      --astc_quality <level>\n               The quality level configures the quality-performance tradeoff for\n               the compressor; more complete searches of the search space\n               improve image quality at the expense of compression time. Default\n               is \'medium\'. The quality level can be set between fastest (0) and\n               exhaustive (100) via the following fixed qua..." /* TRUNCATED STRING LITERAL */
                 );
  ktxApp::usage(&this->super_ktxApp);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<(poVar1,
                           "In case of ambiguity, such as when the last option is one with an optional\nparameter, options can be separated from file names with \" -- \".\n\nAny specified ASTC, ETC1S / BasisLZ, UASTC and supercompression options are\nrecorded in the metadata item @c KTXwriterScParams in the output file.\n"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void usage()
    {
        cerr <<
          "  --encode <astc | etc1s | uastc>\n"
          "               Compress the image data to ASTC, transcodable ETC1S / BasisLZ or\n"
          "               high-quality transcodable UASTC format. Implies --t2.\n"
          "               With each encoding option the following encoder specific options\n"
          "               become valid, otherwise they are ignored.\n\n"
          "    astc:\n"
          "               Create a texture in high-quality ASTC format.\n"
          "      --astc_blk_d <XxY | XxYxZ>\n"
          "               Specify block dimension to use for compressing the textures.\n"
          "               e.g. --astc_blk_d 6x5 for 2D or --astc_blk_d 6x6x6 for 3D.\n"
          "               6x6 is the default for 2D.\n\n"
          "                   Supported 2D block dimensions are:\n\n"
          "                       4x4: 8.00 bpp         10x5:  2.56 bpp\n"
          "                       5x4: 6.40 bpp         10x6:  2.13 bpp\n"
          "                       5x5: 5.12 bpp         8x8:   2.00 bpp\n"
          "                       6x5: 4.27 bpp         10x8:  1.60 bpp\n"
          "                       6x6: 3.56 bpp         10x10: 1.28 bpp\n"
          "                       8x5: 3.20 bpp         12x10: 1.07 bpp\n"
          "                       8x6: 2.67 bpp         12x12: 0.89 bpp\n\n"
          "                   Supported 3D block dimensions are:\n\n"
          "                       3x3x3: 4.74 bpp       5x5x4: 1.28 bpp\n"
          "                       4x3x3: 3.56 bpp       5x5x5: 1.02 bpp\n"
          "                       4x4x3: 2.67 bpp       6x5x5: 0.85 bpp\n"
          "                       4x4x4: 2.00 bpp       6x6x5: 0.71 bpp\n"
          "                       5x4x4: 1.60 bpp       6x6x6: 0.59 bpp\n"
          "      --astc_mode <ldr | hdr>\n"
          "               Specify which encoding mode to use. LDR is the default unless the\n"
          "               input image is 16-bit in which case the default is HDR.\n"
          "      --astc_quality <level>\n"
          "               The quality level configures the quality-performance tradeoff for\n"
          "               the compressor; more complete searches of the search space\n"
          "               improve image quality at the expense of compression time. Default\n"
          "               is 'medium'. The quality level can be set between fastest (0) and\n"
          "               exhaustive (100) via the following fixed quality presets:\n\n"
          "                   Level      |  Quality\n"
          "                   ---------- | -----------------------------\n"
          "                   fastest    | (equivalent to quality =   0)\n"
          "                   fast       | (equivalent to quality =  10)\n"
          "                   medium     | (equivalent to quality =  60)\n"
          "                   thorough   | (equivalent to quality =  98)\n"
          "                   exhaustive | (equivalent to quality = 100)\n"
          "      --astc_perceptual\n"
          "               The codec should optimize for perceptual error, instead of direct\n"
          "               RMS error. This aims to improve perceived image quality, but\n"
          "               typically lowers the measured PSNR score. Perceptual methods are\n"
          "               currently only available for normal maps and RGB color data.\n"
          "    etc1s:\n"
          "               Supercompress the image data with ETC1S / BasisLZ.\n"
          "               RED images will become RGB with RED in each component. RG images\n"
          "               will have R in the RGB part and G in the alpha part of the\n"
          "               compressed texture. When set, the following BasisLZ-related\n"
          "               options become valid, otherwise they are ignored.\n\n"
          "      --no_multithreading\n"
          "               Disable multithreading. Deprecated. For backward compatibility.\n"
          "               Use --threads 1 instead.\n"
          "      --clevel <level>\n"
          "               ETC1S / BasisLZ compression level, an encoding speed vs. quality\n"
          "               tradeoff. Range is [0,5], default is 1. Higher values are slower\n"
          "               but give higher quality.\n"
          "      --qlevel <level>\n"
          "               ETC1S / BasisLZ quality level. Range is [1,255]. Lower gives\n"
          "               better compression/lower quality/faster. Higher gives less\n"
          "               compression/higher quality/slower. --qlevel automatically\n"
          "               determines values for --max_endpoints, --max-selectors,\n"
          "               --endpoint_rdo_threshold and --selector_rdo_threshold for the\n"
          "               target quality level. Setting these options overrides the values\n"
          "               determined by -qlevel which defaults to 128 if neither it nor\n"
          "               both of --max_endpoints and --max_selectors have been set.\n"
          "\n"
          "               Note that both of --max_endpoints and --max_selectors\n"
          "               must be set for them to have any effect. If all three options\n"
          "               are set, a warning will be issued that --qlevel will be ignored.\n"
          "\n"
          "               Note also that --qlevel will only determine values for\n"
          "               --endpoint_rdo_threshold and --selector_rdo_threshold when\n"
          "               its value exceeds 128, otherwise their defaults will be used.\n"
          "      --max_endpoints <arg>\n"
          "               Manually set the maximum number of color endpoint clusters. Range\n"
          "               is [1,16128]. Default is 0, unset.\n"
          "      --endpoint_rdo_threshold <arg>\n"
          "               Set endpoint RDO quality threshold. The default is 1.25. Lower\n"
          "               is higher quality but less quality per output bit (try\n"
          "               [1.0,3.0]). This will override the value chosen by --qlevel.\n"
          "      --max_selectors <arg>\n"
          "               Manually set the maximum number of color selector clusters from\n"
          "               [1,16128]. Default is 0, unset.\n"
          "      --selector_rdo_threshold <arg>\n"
          "               Set selector RDO quality threshold. The default is 1.25. Lower\n"
          "               is higher quality but less quality per output bit (try\n"
          "               [1.0,3.0]). This will override the value chosen by --qlevel.\n"
          "      --no_endpoint_rdo\n"
          "               Disable endpoint rate distortion optimizations. Slightly faster,\n"
          "               less noisy output, but lower quality per output bit. Default is\n"
          "               to do endpoint RDO.\n"
          "      --no_selector_rdo\n"
          "               Disable selector rate distortion optimizations. Slightly faster,\n"
          "               less noisy output, but lower quality per output bit. Default is\n"
          "               to do selector RDO.\n\n"
          "    uastc:\n"
          "               Create a texture in high-quality transcodable UASTC format.\n"
          "      --uastc_quality <level>\n"
          "               This optional parameter selects a speed vs quality\n"
          "               tradeoff as shown in the following table:\n"
          "\n"
          "                   Level |  Speed    | Quality\n"
          "                   ----- | --------- | -------\n"
          "                     0   |  Fastest  | 43.45dB\n"
          "                     1   |  Faster   | 46.49dB\n"
          "                     2   |  Default  | 47.47dB\n"
          "                     3   |  Slower   | 48.01dB\n"
          "                     4   | Very slow | 48.24dB\n"
          "\n"
          "               You are strongly encouraged to also specify --zcmp to losslessly\n"
          "               compress the UASTC data. This and any LZ-style compression can\n"
          "               be made more effective by conditioning the UASTC texture data\n"
          "               using the Rate Distortion Optimization (RDO) post-process stage.\n"
          "               When uastc encoding is set the following options become available\n"
          "               for controlling RDO:\n\n"
          "      --uastc_rdo_l [<lambda>]\n"
          "               Enable UASTC RDO post-processing and optionally set UASTC RDO\n"
          "               quality scalar (lambda) to @e lambda.  Lower values yield higher\n"
          "               quality/larger LZ compressed files, higher values yield lower\n"
          "               quality/smaller LZ compressed files. A good range to try is\n"
          "               [.25,10]. For normal maps a good range is [.25,.75]. The full\n"
          "               range is [.001,10.0]. Default is 1.0.\n"
          "\n"
          "               Note that previous versions used the --uastc_rdo_q option which\n"
          "               was removed because the RDO algorithm changed.\n"
          "      --uastc_rdo_d <dictsize>\n"
          "               Set UASTC RDO dictionary size in bytes. Default is 4096. Lower\n"
          "               values=faster, but give less compression. Range is [64,65536].\n"
          "      --uastc_rdo_b <scale>\n"
          "               Set UASTC RDO max smooth block error scale. Range is [1.0,300.0].\n"
          "               Default is 10.0, 1.0 is disabled. Larger values suppress more\n"
          "               artifacts (and allocate more bits) on smooth blocks.\n"
          "      --uastc_rdo_s <deviation>\n"
          "               Set UASTC RDO max smooth block standard deviation. Range is\n"
          "               [.01,65536.0]. Default is 18.0. Larger values expand the range\n"
          "               of blocks considered smooth.<dd>\n"
          "      --uastc_rdo_f\n"
          "               Do not favor simpler UASTC modes in RDO mode.\n"
          "      --uastc_rdo_m\n"
          "               Disable RDO multithreading (slightly higher compression,\n"
          "               deterministic).\n\n"
          "  --input_swizzle <swizzle>\n"
          "               Swizzle the input components according to swizzle which is an\n"
          "               alhpanumeric sequence matching the regular expression\n"
          "               ^[rgba01]{4}$.\n"
          "  --normal_mode\n"
          "               Only valid for linear textures with two or more components. If\n"
          "               the input texture has three or four linear components it is\n"
          "               assumed to be a three component linear normal map storing unit\n"
          "               length normals as (R=X, G=Y, B=Z). A fourth component will be\n"
          "               ignored. The map will be converted to a two component X+Y normal\n"
          "               map stored as (RGB=X, A=Y) prior to encoding. If unsure that\n"
          "               your normals are unit length, use @b --normalize. If the input\n"
          "               has 2 linear components it is assumed to be an X+Y map of unit\n"
          "               normals.\n\n"
          "               The Z component can be recovered programmatically in shader\n"
          "               code by using the equations:\n\n"
          "                   nml.xy = texture(...).ga;              // Load in [0,1]\n"
          "                   nml.xy = nml.xy * 2.0 - 1.0;           // Unpack to [-1,1]\n"
          "                   nml.z = sqrt(1 - dot(nml.xy, nml.xy)); // Compute Z\n\n"
          "               Encoding is optimized for normal maps. For ASTC encoding,\n"
          "              '--encode astc', encoder parameters are tuned for better quality\n"
          "               on normal maps. .  For ETC1S encoding, '--encode etc1s',i RDO is\n"
          "               disabled (no selector RDO, no endpoint RDO) to provide better\n"
          "               quality.\n\n"
          "               You can prevent conversion of the normal map to two components\n"
          "               by specifying '--input_swizzle rgb1'.\n\n"
          "  --normalize\n"
          "               Normalize input normals to have a unit length. Only valid for\n"
          "               linear textures with 2 or more components. For 2-component inputs\n"
          "               2D unit normals are calculated. Do not use these 2D unit normals\n"
          "               to generate X+Y normals for --normal_mode. For 4-component inputs\n"
          "               a 3D unit normal is calculated. 1.0 is used for the value of the\n"
          "               4th component.\n"
          "  --no_sse\n"
          "               Forbid use of the SSE instruction set. Ignored if CPU does not\n"
          "               support SSE. Only the Basis Universal compressor uses SSE.\n"
          "  --bcmp\n"
          "               Deprecated. Use '--encode etc1s' instead.\n"
          "  --uastc [<level>]\n"
          "               Deprecated. Use '--encode uastc' instead.\n"
          "  --zcmp [<compressionLevel>]\n"
          "               Supercompress the data with Zstandard. Implies --t2. Can be used\n"
          "               with data in any format except ETC1S / BasisLZ. Most\n"
          "               effective with RDO-conditioned UASTC or uncompressed formats. The\n"
          "               optional compressionLevel range is 1 - 22 and the default is 3.\n"
          "               Lower values=faster but give less compression. Values above 20\n"
          "               should be used with caution as they require more memory.\n"
          "  --threads <count>\n"
          "               Explicitly set the number of threads to use during compression.\n"
          "               By default, ETC1S / BasisLZ and ASTC compression will use the\n"
          "               number of threads reported by thread::hardware_concurrency or 1\n"
          "               if value returned is 0.\n"
          "  --verbose\n"
          "               Print encoder/compressor activity status to stdout. Currently\n"
          "               only the astc, etc1s and uastc encoders emit status.\n"
          "\n";
          ktxApp::usage();
          cerr << endl <<
          "In case of ambiguity, such as when the last option is one with an optional\n"
          "parameter, options can be separated from file names with \" -- \".\n"
          "\n"
          "Any specified ASTC, ETC1S / BasisLZ, UASTC and supercompression options are\n"
          "recorded in the metadata item @c KTXwriterScParams in the output file.\n"
          << endl;
    }